

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regfileparser.cpp
# Opt level: O2

string * GetValueSpecFromSetSpec(string *__return_storage_ptr__,string *spec,size_t start)

{
  char quotechar;
  
  quotechar = (spec->_M_dataplus)._M_p[start];
  if ((quotechar == '\'') || (quotechar == '\"')) {
    findendquote(spec,start + 1,quotechar);
  }
  std::__cxx11::string::find((char)spec,0x3d);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)spec);
  return __return_storage_ptr__;
}

Assistant:

std::string GetValueSpecFromSetSpec(const std::string& spec, size_t start)
{
    if (spec[start]=='\'' || spec[start]=='\"')
    {
        size_t endquote= findendquote(spec, start+1, spec[start]);
        //debug("GetValueSpecFromSetSpec:%s\n", spec.substr(endquote).c_str());

        //todo: check for missing quote.
        size_t eqpos= spec.find('=', endquote);
        return spec.substr(eqpos+1);
    }
    size_t eqpos= spec.find('=');

    //debug("GetValueSpecFromSetSpec:%s\n", spec.substr(eqpos+1).c_str());
    return spec.substr(eqpos+1);
}